

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

double __thiscall
libcellml::Generator::GeneratorImpl::scalingFactor(GeneratorImpl *this,VariablePtr *variable)

{
  double dVar1;
  undefined1 local_58 [16];
  shared_ptr<libcellml::Variable> local_48;
  undefined1 local_38 [32];
  VariablePtr *local_18;
  VariablePtr *variable_local;
  GeneratorImpl *this_local;
  
  local_18 = variable;
  variable_local = (VariablePtr *)this;
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             variable);
  Variable::units((Variable *)(local_38 + 0x10));
  analyserVariable((GeneratorImpl *)local_58,(VariablePtr *)this);
  std::__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_58);
  AnalyserVariable::variable((AnalyserVariable *)(local_58 + 0x10));
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             (local_58 + 0x10));
  Variable::units((Variable *)local_38);
  dVar1 = Units::scalingFactor((UnitsPtr *)(local_38 + 0x10),(UnitsPtr *)local_38,true);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_38);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)(local_58 + 0x10));
  std::shared_ptr<libcellml::AnalyserVariable>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserVariable> *)local_58);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)(local_38 + 0x10));
  return dVar1;
}

Assistant:

double Generator::GeneratorImpl::scalingFactor(const VariablePtr &variable) const
{
    // Return the scaling factor for the given variable.

    return Units::scalingFactor(variable->units(), analyserVariable(variable)->variable()->units());
}